

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void __thiscall FConsoleCommand::FConsoleCommand(FConsoleCommand *this,char *name,CCmdRun runFunc)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  char tname [16];
  
  this->_vptr_FConsoleCommand = (_func_int **)&PTR__FConsoleCommand_007c6798;
  this->m_RunFunc = runFunc;
  if (FConsoleCommand(char_const*,void(*)(FCommandLine&,APlayerPawn*,int))::firstTime == '\0') {
    FConsoleCommand(char_const*,void(*)(FCommandLine&,APlayerPawn*,int))::firstTime = '\x01';
    for (lVar3 = 0xc; lVar3 != 0x30c; lVar3 = lVar3 + 0x18) {
      strcpy(tname + 1,ActionMaps[0].Name + lVar3 + -0xc);
      tname[0] = '+';
      C_AddTabCommand(tname);
      tname[0] = '-';
      C_AddTabCommand(tname);
    }
  }
  pcVar2 = copystring(name);
  this->m_Name = pcVar2;
  bVar1 = AddToHash(this,Commands);
  if (bVar1) {
    C_AddTabCommand(name);
  }
  else {
    Printf("FConsoleCommand c\'tor: %s exists\n",name);
  }
  return;
}

Assistant:

FConsoleCommand::FConsoleCommand (const char *name, CCmdRun runFunc)
	: m_RunFunc (runFunc)
{
	static bool firstTime = true;

	if (firstTime)
	{
		char tname[16];
		unsigned int i;

		firstTime = false;

		// Add all the action commands for tab completion
		for (i = 0; i < NUM_ACTIONS; i++)
		{
			strcpy (&tname[1], ActionMaps[i].Name);
			tname[0] = '+';
			C_AddTabCommand (tname);
			tname[0] = '-';
			C_AddTabCommand (tname);
		}
	}

	int ag = strcmp (name, "kill");
	if (ag == 0)
		ag=0;
	m_Name = copystring (name);

	if (!AddToHash (Commands))
		Printf ("FConsoleCommand c'tor: %s exists\n", name);
	else
		C_AddTabCommand (name);
}